

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkTrajectory.cpp
# Opt level: O1

void __thiscall chrono::ChLinkTrajectory::UpdateTime(ChLinkTrajectory *this,double time)

{
  element_type *peVar1;
  ChLog *this_00;
  Vector result;
  Vector resultA;
  Vector resultB;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double dStack_60;
  double local_58;
  double local_48;
  double dStack_40;
  double local_38;
  double local_28;
  double dStack_20;
  double local_18;
  
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj.ChTime = time;
  local_78 = time;
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  local_70 = time + 0.0001;
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  local_80 = time + -0.0001;
  (*((this->space_fx).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  if ((this->trajectory_line).
      super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    local_68 = 0.0;
    dStack_60 = 0.0;
    local_58 = 0.0;
    local_18 = 0.0;
    local_28 = 0.0;
    dStack_20 = 0.0;
    local_38 = 0.0;
    local_48 = 0.0;
    dStack_40 = 0.0;
    if (this->modulo_s == true) {
      local_78 = fmod(local_78,1.0);
      local_80 = fmod(local_80,1.0);
      local_70 = fmod(local_70,1.0);
    }
    peVar1 = (this->trajectory_line).
             super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xb])(local_78,peVar1,&local_68);
    peVar1 = (this->trajectory_line).
             super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xb])(local_80,peVar1,&local_48);
    peVar1 = (this->trajectory_line).
             super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar1->super_ChGeometry)._vptr_ChGeometry[0xb])(local_70,peVar1,&local_28);
    ChMarker::Impose_Rel_Coord
              ((this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.marker2,
               (Coordsys *)&CSYSNORM);
    if ((Coordsys *)&local_68 != &(this->super_ChLinkLockLock).deltaC) {
      (this->super_ChLinkLockLock).deltaC.pos.m_data[0] = local_68;
      (this->super_ChLinkLockLock).deltaC.pos.m_data[1] = dStack_60;
      (this->super_ChLinkLockLock).deltaC.pos.m_data[2] = local_58;
    }
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[0] = (local_28 - local_48) * 5000.0;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[1] = (dStack_20 - dStack_40) * 5000.0;
    (this->super_ChLinkLockLock).deltaC_dt.pos.m_data[2] = (local_18 - local_38) * 5000.0;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[0] =
         ((local_28 + local_48) - (local_68 + local_68)) * 100000000.0;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[1] =
         ((dStack_20 + dStack_40) - (dStack_60 + dStack_60)) * 100000000.0;
    (this->super_ChLinkLockLock).deltaC_dtdt.pos.m_data[2] =
         ((local_18 + local_38) - (local_58 + local_58)) * 100000000.0;
    if (this != (ChLinkTrajectory *)(sBulletDNAstr64 + 0x26f0)) {
      (this->super_ChLinkLockLock).deltaC.rot.m_data[0] = QUNIT;
      (this->super_ChLinkLockLock).deltaC.rot.m_data[1] = DAT_00b90978;
      (this->super_ChLinkLockLock).deltaC.rot.m_data[2] = DAT_00b90980;
      (this->super_ChLinkLockLock).deltaC.rot.m_data[3] = DAT_00b90988;
    }
    if (this != (ChLinkTrajectory *)(sBulletDNAstr64 + 0x2698)) {
      (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[0] = QNULL;
      (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[1] = DAT_00b90958;
      (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[2] = DAT_00b90960;
      (this->super_ChLinkLockLock).deltaC_dt.rot.m_data[3] = DAT_00b90968;
    }
    if (this != (ChLinkTrajectory *)(sBulletDNAstr64 + 0x2660)) {
      (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[0] = QNULL;
      (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[1] = DAT_00b90958;
      (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[2] = DAT_00b90960;
      (this->super_ChLinkLockLock).deltaC_dtdt.rot.m_data[3] = DAT_00b90968;
    }
    return;
  }
  this_00 = GetLog();
  ChStreamOutAscii::operator<<(&this_00->super_ChStreamOutAscii,"NO TRAJECTORY \n");
  return;
}

Assistant:

void ChLinkTrajectory::UpdateTime(double time) {
    ChTime = time;

    double tstep = BDF_STEP_HIGH;
    double tr_time = space_fx->Get_y(time);
    double tr_timeB = space_fx->Get_y(time + tstep);
    double tr_timeA = space_fx->Get_y(time - tstep);

    if (trajectory_line) {
        Vector result, resultB, resultA;
        if (modulo_s) {
            tr_time = fmod(tr_time, 1);
            tr_timeA = fmod(tr_timeA, 1);
            tr_timeB = fmod(tr_timeB, 1);
        }
        trajectory_line->Evaluate(result, tr_time);
        trajectory_line->Evaluate(resultA, tr_timeA);
        trajectory_line->Evaluate(resultB, tr_timeB);

        ChMatrix33<> mw;
        mw.Set_A_quaternion(marker2->GetAbsCoord().rot);

        // if line coordinate is relative to body2:
        marker2->Impose_Rel_Coord(CSYSNORM);
        deltaC.pos = result;
        deltaC_dt.pos = (resultB - resultA) * (1 / (2 * tstep));
        deltaC_dtdt.pos = (resultA + resultB - result * 2) * (4 / pow(2 * tstep, 2));
        /*
        // if line coordinate is relative to absolute space:
        deltaC.pos = mw.transpose() * (result - marker2->GetAbsCoord().pos);  //// CORRECT?
        deltaC_dt.pos = mw.transpose() * ((resultB - resultA) * (1 / (2 * tstep)));
        deltaC_dtdt.pos = mw.transpose() * ((resultA + resultB - result * 2) * (4 / pow(2 * tstep, 2)));
        */

        deltaC.rot = QUNIT;
        deltaC_dt.rot = QNULL;
        deltaC_dtdt.rot = QNULL;
    } else {
        GetLog() << "NO TRAJECTORY \n";
    }
}